

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O0

void __thiscall OpenMD::NPTf::calcVelScale(NPTf *this)

{
  double dVar1;
  double *pdVar2;
  long in_RDI;
  int j;
  int i;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; (int)local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; (int)local_10 < 3; local_10 = local_10 + 1) {
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_c,local_10);
      dVar1 = *pdVar2;
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x2e0),local_c,local_10);
      *pdVar2 = dVar1;
      if (local_c == local_10) {
        dVar1 = *(double *)(in_RDI + 0x1a0);
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x2e0),local_c,local_10);
        *pdVar2 = dVar1 + *pdVar2;
      }
    }
  }
  return;
}

Assistant:

void NPTf::calcVelScale() {
    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        vScale(i, j) = eta(i, j);

        if (i == j) { vScale(i, j) += thermostat.first; }
      }
    }
  }